

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<spirv_cross::Resource,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
          (SmallVector<spirv_cross::Resource,_8UL> *this,
          SmallVector<spirv_cross::Resource,_8UL> *other)

{
  Resource *__ptr;
  ulong uVar1;
  size_t sVar2;
  Resource *pRVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  
  clear(this);
  pRVar3 = (other->super_VectorView<spirv_cross::Resource>).ptr;
  if (pRVar3 == (Resource *)&other->stack_storage) {
    reserve(this,(other->super_VectorView<spirv_cross::Resource>).buffer_size);
    lVar5 = 0;
    for (uVar4 = 0; uVar1 = (other->super_VectorView<spirv_cross::Resource>).buffer_size,
        uVar4 < uVar1; uVar4 = uVar4 + 1) {
      Resource::Resource((Resource *)
                         ((long)&(((this->super_VectorView<spirv_cross::Resource>).ptr)->id).id +
                         lVar5),(Resource *)
                                ((long)&(((other->super_VectorView<spirv_cross::Resource>).ptr)->id)
                                        .id + lVar5));
      ::std::__cxx11::string::~string
                ((string *)
                 ((long)&(((other->super_VectorView<spirv_cross::Resource>).ptr)->name)._M_dataplus.
                         _M_p + lVar5));
      lVar5 = lVar5 + 0x30;
    }
    (this->super_VectorView<spirv_cross::Resource>).buffer_size = uVar1;
    (other->super_VectorView<spirv_cross::Resource>).buffer_size = 0;
  }
  else {
    __ptr = (this->super_VectorView<spirv_cross::Resource>).ptr;
    if (__ptr != (Resource *)&this->stack_storage) {
      free(__ptr);
      pRVar3 = (other->super_VectorView<spirv_cross::Resource>).ptr;
    }
    (this->super_VectorView<spirv_cross::Resource>).ptr = pRVar3;
    sVar2 = other->buffer_capacity;
    (this->super_VectorView<spirv_cross::Resource>).buffer_size =
         (other->super_VectorView<spirv_cross::Resource>).buffer_size;
    this->buffer_capacity = sVar2;
    (other->super_VectorView<spirv_cross::Resource>).ptr = (Resource *)0x0;
    (other->super_VectorView<spirv_cross::Resource>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}